

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint128.hpp
# Opt level: O3

basic_istream<wchar_t,_std::char_traits<wchar_t>_> *
trng::impl::operator>>(basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in,uint128 *value)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar3 = *(uint *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  std::ws<wchar_t,std::char_traits<wchar_t>>((wistream *)in);
  uVar2 = std::wistream::peek();
  if ((uVar3 & 0x4a) == 8) {
    if ((uVar2 - 0x30 < 10) ||
       ((uVar2 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(uVar2 - 0x41) & 0x3f) & 1) != 0)))) {
      iVar4 = 1;
      uVar9 = 0;
      uVar8 = 0;
      do {
        iVar5 = std::wistream::peek();
        if ((iVar5 - 0x30U < 10) ||
           ((iVar5 - 0x41U < 0x26 && ((0x3f0000003fU >> ((ulong)(iVar5 - 0x41U) & 0x3f) & 1) != 0)))
           ) {
          if (iVar4 == 0) goto LAB_001da3ed;
LAB_001da407:
          if (uVar9 >> 0x3c != 0) break;
          iVar5 = std::wistream::get();
          uVar3 = iVar5 - 0x30;
          if (9 < uVar3) {
            if (iVar5 - 0x61U < 6) {
              uVar3 = iVar5 - 0x57;
            }
            else {
              uVar3 = iVar5 - 0x37;
            }
          }
          uVar6 = uVar8 >> 0x3c;
          uVar7 = uVar8 * 0x10;
          uVar8 = uVar7 + uVar3;
          uVar9 = (uVar6 | uVar9 << 4) + (ulong)CARRY8(uVar7,(ulong)uVar3);
        }
        else {
          if ((iVar4 != 0) || (uVar3 = std::wistream::peek(), (uVar3 & 0xffffffdf) != 0x58)) {
            *(ulong *)&value->value = uVar8;
            *(ulong *)((long)&value->value + 8) = uVar9;
            return in;
          }
LAB_001da3ed:
          uVar3 = std::wistream::peek();
          if ((uVar3 & 0xffffffdf) != 0x58) goto LAB_001da407;
          std::wistream::get();
        }
        iVar4 = iVar4 + -1;
      } while( true );
    }
  }
  else if ((uVar3 & 0x4a) == 0x40) {
    if ((uVar2 & 0xfffffff8) == 0x30) {
      uVar3 = std::wistream::peek();
      if ((uVar3 & 0xfffffff8) == 0x30) {
        uVar8 = 0;
        uVar9 = 0;
        do {
          if (uVar8 >> 0x3d != 0) goto LAB_001da51a;
          uVar6 = uVar9 * 8;
          iVar4 = std::wistream::get();
          uVar7 = uVar9 >> 0x3d;
          uVar9 = (iVar4 - 0x30) + uVar6;
          uVar8 = (uVar8 << 3 | uVar7) + (ulong)CARRY8((ulong)(iVar4 - 0x30),uVar6);
          uVar3 = std::wistream::peek();
        } while ((uVar3 & 0xfffffff8) == 0x30);
      }
      else {
        uVar9 = 0;
        uVar8 = 0;
      }
      *(ulong *)&value->value = uVar9;
      *(ulong *)((long)&value->value + 8) = uVar8;
      return in;
    }
  }
  else if (uVar2 - 0x30 < 10) {
    iVar4 = std::wistream::peek();
    if (iVar4 - 0x30U < 10) {
      uVar9 = 0;
      uVar8 = 0;
      do {
        if (0x1999999999999998 < uVar9 &&
            (ulong)(uVar8 < 0x999999999999999a) <= uVar9 + 0xe666666666666667) goto LAB_001da51a;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar8;
        uVar6 = SUB168(auVar1 * ZEXT816(10),0);
        uVar9 = SUB168(auVar1 * ZEXT816(10),8) + uVar9 * 10;
        iVar4 = std::wistream::get();
        uVar3 = iVar4 - 0x30;
        if (~uVar9 < (ulong)(~uVar6 < (ulong)uVar3)) goto LAB_001da51a;
        uVar8 = uVar6 + uVar3;
        uVar9 = uVar9 + CARRY8(uVar6,(ulong)uVar3);
        iVar4 = std::wistream::peek();
      } while (iVar4 - 0x30U < 10);
    }
    else {
      uVar8 = 0;
      uVar9 = 0;
    }
    *(ulong *)&value->value = uVar8;
    *(ulong *)((long)&value->value + 8) = uVar9;
    return in;
  }
LAB_001da51a:
  std::wios::clear((int)in + (int)*(undefined8 *)(*(long *)in + -0x18));
  return in;
}

Assistant:

std::basic_istream<T,
        TRAIT> &operator>>(std::basic_istream<T,
        TRAIT> &in, UINT128 &value) {
      const auto stream_flags{in.flags()};

      const auto is_dec_digit = [](typename TRAIT::int_type c) -> bool {
        return T('0') <= c and c <= T('9');
      };
      const auto dec_digit_to_uint128 = [](typename TRAIT::int_type c) -> UINT128 {
        return static_cast<UINT128>(
            static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('0')));
      };

      const auto is_oct_digit = [](typename TRAIT::int_type c) -> bool {
        return T('0') <= c and c <= T('7');
      };
      const auto oct_digit_to_uint128 = [](typename TRAIT::int_type c) -> UINT128 {
        return static_cast<UINT128>(
            static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('0')));
      };

      const auto is_hex_digit = [](typename TRAIT::int_type c) -> bool {
        return (T('0') <= c and c <= T('9')) or (T('a') <= c and c <= T('f')) or
               (T('A') <= c and c <= T('F'));
      };
      const auto is_hex_basechar = [](typename TRAIT::int_type c) -> bool {
        return c == T('x') or c == T('X');
      };
      const auto hex_digit_to_uint128 = [](typename TRAIT::int_type c) -> UINT128 {
        if (T('0') <= c and c <= T('9'))
          return static_cast<UINT128>(
              static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('0')));
        if (T('a') <= c and c <= T('f'))
          return static_cast<UINT128>(
              static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('a') + 10));
        return static_cast<UINT128>(
            static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('A') + 10));
      };

      in >> std::ws;

      switch (stream_flags & std::ios_base::basefield) {
        case std::ios_base::oct: {
          const UINT128 mult_overflow{0x2000000000000000, 0x000000000000000};  // 2^128 / 8
          if (not is_oct_digit(in.peek())) {
            in.setstate(std::ios_base::failbit);
            return in;
          }
          UINT128 result;
          while (is_oct_digit(in.peek())) {
            if (result >= mult_overflow) {
              in.setstate(std::ios_base::failbit);
              return in;
            }
            result *= static_cast<UINT128>(static_cast<std::uint64_t>(8));
            result += oct_digit_to_uint128(in.get());
          }
          value = result;
        }
          break;
        case std::ios_base::dec:
        default: {
          const UINT128 mult_overflow{0x1999999999999999,
                                      0x999999999999999a};  // ceil(2^128 / 10)
          const UINT128 max{0xffffffffffffffff, 0xffffffffffffffff};  // 2^128 - 1
          if (not is_dec_digit(in.peek())) {
            in.setstate(std::ios_base::failbit);
            return in;
          }
          UINT128 result;
          while (is_dec_digit(in.peek())) {
            if (result >= mult_overflow) {
              in.setstate(std::ios_base::failbit);
              return in;
            }
            result *= static_cast<UINT128>(static_cast<std::uint64_t>(10));
            const auto next_digit{dec_digit_to_uint128(in.get())};
            if (next_digit > max - result) {
              in.setstate(std::ios_base::failbit);
              return in;
            }
            result += next_digit;
          }
          value = result;
        }
          break;
        case std::ios_base::hex: {
          const UINT128 mult_overflow{0x1000000000000000, 0x000000000000000};  // 2^128 / 16
          if (not is_hex_digit(in.peek())) {
            in.setstate(std::ios_base::failbit);
            return in;
          }
          UINT128 result;
          int pos{0};
          while (is_hex_digit(in.peek()) or (pos == 1 and is_hex_basechar(in.peek()))) {
            if (pos == 1 and is_hex_basechar(in.peek())) {
              in.get();
            } else {
              if (result >= mult_overflow) {
                in.setstate(std::ios_base::failbit);
                return in;
              }
              result *= static_cast<UINT128>(static_cast<std::uint64_t>(16));
              result += hex_digit_to_uint128(in.get());
            }
            ++pos;
          }
          value = result;
        }
          break;
      }

      return in;
    }